

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O3

Vec_Wrd_t * Ifd_ManDsdTruths(int nVars)

{
  ulong uVar1;
  Ifd_Obj_t *pIVar2;
  uint uVar3;
  uint uVar4;
  Vec_Wrd_t *pVVar5;
  Ifd_Obj_t *pIVar6;
  Ifd_Man_t *p;
  Vec_Int_t *pVVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int *piVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  long local_98;
  ulong local_80;
  
  p = Ifd_ManStart();
  if (1 < nVars) {
    local_80 = 1;
    uVar8 = 2;
    do {
      uVar15 = 1;
      do {
        uVar1 = uVar15 + 1;
        uVar16 = 1;
        do {
          if (uVar16 + uVar15 == uVar8) {
            pVVar7 = p->vMarks;
            uVar3 = pVVar7->nSize;
            uVar9 = (ulong)uVar3;
            if (((long)(int)uVar3 <= (long)uVar15) || ((long)(int)uVar3 <= (long)uVar1)) {
LAB_003f6b90:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            piVar11 = pVVar7->pArray;
            uVar3 = piVar11[uVar15];
            uVar17 = (ulong)uVar3;
            while( true ) {
              local_98 = uVar16 + 1;
              iVar18 = (int)uVar17;
              if (piVar11[uVar1] <= iVar18) break;
              if (((int)uVar3 < 0) || (p->nObjs <= iVar18)) {
LAB_003f6b71:
                __assert_fail("i >= 0 && i < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                              ,0x49,"Ifd_Obj_t *Ifd_ManObj(Ifd_Man_t *, int)");
              }
              if (p->pObjs == (Ifd_Obj_t *)0x0) break;
              if (((uVar9 & 0xffffffff) <= uVar16) || ((long)(int)uVar9 <= (long)(uVar16 + 1)))
              goto LAB_003f6b90;
              uVar4 = piVar11[uVar16];
              piVar11 = pVVar7->pArray;
              if ((int)uVar4 < piVar11[uVar16 + 1]) {
                pIVar2 = p->pObjs + uVar17;
                iVar20 = iVar18 * 2;
                iVar12 = iVar18 * 2 + 1;
                iVar18 = uVar4 * 2;
                lVar23 = (ulong)uVar4 << 4;
                uVar19 = uVar4;
                do {
                  if (((int)uVar4 < 0) || (p->nObjs <= (int)uVar19)) goto LAB_003f6b71;
                  pIVar6 = p->pObjs;
                  if (pIVar6 == (Ifd_Obj_t *)0x0) break;
                  if (uVar15 != ((byte)pIVar2->field_0x3 & 0x1f)) {
                    __assert_fail("(int)pLeaf0->nSupp == i",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                  ,0x288,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                  }
                  if (uVar16 != (*(byte *)((long)pIVar6->pFans + lVar23 + -1) & 0x1f)) {
                    __assert_fail("(int)pLeaf1->nSupp == j",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                  ,0x289,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                  }
                  Ifd_ManOper(p,iVar20,iVar18,-1,1);
                  if (-1 < *(int *)((long)pIVar6->pFans + lVar23 + -4)) {
                    Ifd_ManOper(p,iVar20,iVar18 + 1,-1,1);
                  }
                  if (((-1 < *(int *)pIVar2) &&
                      (Ifd_ManOper(p,iVar12,iVar18,-1,1), -1 < *(int *)pIVar2)) &&
                     (-1 < *(int *)((long)pIVar6->pFans + lVar23 + -4))) {
                    Ifd_ManOper(p,iVar12,iVar18 + 1,-1,1);
                  }
                  Ifd_ManOper(p,iVar20,iVar18,-1,2);
                  pVVar7 = p->vMarks;
                  uVar9 = (ulong)pVVar7->nSize;
                  if ((long)uVar9 <= local_98) goto LAB_003f6b90;
                  piVar11 = pVVar7->pArray;
                  uVar19 = uVar19 + 1;
                  iVar18 = iVar18 + 2;
                  lVar23 = lVar23 + 0x10;
                } while ((int)uVar19 < piVar11[uVar16 + 1]);
              }
              uVar17 = uVar17 + 1;
              if ((long)(int)uVar9 <= (long)uVar1) goto LAB_003f6b90;
            }
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar8);
        uVar15 = uVar1;
      } while (uVar1 != uVar8);
      if (2 < uVar8) {
        uVar15 = 1;
        do {
          uVar1 = uVar15 + 1;
          uVar16 = 1;
          do {
            uVar9 = uVar16 + 1;
            uVar17 = 1;
            do {
              if (uVar16 + uVar15 + uVar17 == uVar8) {
                pVVar7 = p->vMarks;
                uVar3 = pVVar7->nSize;
                uVar10 = (ulong)uVar3;
                if (((long)(int)uVar3 <= (long)uVar15) || ((long)(int)uVar3 <= (long)uVar1))
                goto LAB_003f6b90;
                uVar3 = pVVar7->pArray[uVar15];
                uVar14 = (ulong)uVar3;
                while( true ) {
                  piVar11 = pVVar7->pArray;
                  iVar18 = (int)uVar14;
                  if (piVar11[uVar1] <= iVar18) break;
                  if (((int)uVar3 < 0) || (p->nObjs <= iVar18)) goto LAB_003f6b71;
                  if (p->pObjs == (Ifd_Obj_t *)0x0) break;
                  if (((uVar10 & 0xffffffff) <= uVar16) || ((long)(int)uVar10 <= (long)uVar9))
                  goto LAB_003f6b90;
                  pIVar2 = p->pObjs + uVar14;
                  uVar4 = piVar11[uVar16];
                  uVar22 = (ulong)uVar4;
                  while (iVar20 = (int)uVar22, iVar20 < piVar11[uVar9]) {
                    if (((int)uVar4 < 0) || (p->nObjs <= iVar20)) goto LAB_003f6b71;
                    if (p->pObjs == (Ifd_Obj_t *)0x0) break;
                    if (((uVar10 & 0xffffffff) <= uVar17) ||
                       ((long)(int)uVar10 <= (long)(uVar17 + 1))) goto LAB_003f6b90;
                    uVar19 = piVar11[uVar17];
                    uVar13 = (ulong)uVar19;
                    piVar11 = pVVar7->pArray;
                    if ((int)uVar19 < piVar11[uVar17 + 1]) {
                      pIVar6 = p->pObjs + uVar22;
                      lVar23 = uVar13 << 4;
                      iVar12 = uVar19 * 2;
                      do {
                        if (((int)uVar19 < 0) || (p->nObjs <= (int)uVar13)) goto LAB_003f6b71;
                        if (p->pObjs == (Ifd_Obj_t *)0x0) break;
                        if (uVar15 != ((byte)pIVar2->field_0x3 & 0x1f)) {
                          __assert_fail("(int)pLeaf0->nSupp == i",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                        ,0x29f,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                        }
                        if (uVar16 != ((byte)pIVar6->field_0x3 & 0x1f)) {
                          __assert_fail("(int)pLeaf1->nSupp == j",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                        ,0x2a0,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                        }
                        uVar21 = *(uint *)((long)p->pObjs->pFans + lVar23 + -4);
                        if (uVar17 != (uVar21 >> 0x18 & 0x1f)) {
                          __assert_fail("(int)pLeaf2->nSupp == k",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                        ,0x2a1,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                        }
                        if ((((-1 < (int)uVar21) || (iVar20 <= iVar18)) &&
                            (Ifd_ManOper(p,iVar18 * 2,iVar20 * 2,iVar12,3), -1 < *(int *)pIVar2)) &&
                           (-1 < *(int *)pIVar6)) {
                          Ifd_ManOper(p,iVar18 * 2 + 1,iVar20 * 2,iVar12,3);
                        }
                        pVVar7 = p->vMarks;
                        uVar10 = (ulong)pVVar7->nSize;
                        if ((long)uVar10 <= (long)(uVar17 + 1)) goto LAB_003f6b90;
                        piVar11 = pVVar7->pArray;
                        uVar21 = (int)uVar13 + 1;
                        uVar13 = (ulong)uVar21;
                        lVar23 = lVar23 + 0x10;
                        iVar12 = iVar12 + 2;
                      } while ((int)uVar21 < piVar11[uVar17 + 1]);
                    }
                    uVar22 = uVar22 + 1;
                    if ((long)(int)uVar10 <= (long)uVar9) goto LAB_003f6b90;
                  }
                  uVar14 = uVar14 + 1;
                  uVar10 = (ulong)pVVar7->nSize;
                  if ((long)uVar10 <= (long)uVar1) goto LAB_003f6b90;
                }
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != local_80);
            uVar16 = uVar9;
          } while (uVar9 != local_80);
          uVar15 = uVar1;
        } while (uVar1 != local_80);
      }
      Vec_IntPush(p->vMarks,p->nObjs);
      uVar8 = uVar8 + 1;
      local_80 = local_80 + 1;
    } while (uVar8 != nVars + 1);
  }
  Ifd_ManTruthAll(p);
  Mpm_ComputeCnfSizeAll(p);
  pVVar5 = p->vTruths;
  p->vTruths = (Vec_Wrd_t *)0x0;
  Ifd_ManStop(p);
  return pVVar5;
}

Assistant:

Vec_Wrd_t * Ifd_ManDsdTruths( int nVars )
{
    int fUseMux = 1;
    Vec_Wrd_t * vTruths;
    Ifd_Man_t * pMan = Ifd_ManStart();
    Ifd_Obj_t * pLeaf0, * pLeaf1, * pLeaf2;
    int v, i, j, k, c0, c1, c2;
    for ( v = 2; v <= nVars; v++ )
    {
        // create ANDs/XORs
        for ( i = 1; i < v; i++ )
        for ( j = 1; j < v; j++ )
        if ( i + j == v )
        {
            Ifd_ManForEachNodeWithSupp( pMan, i, pLeaf0, c0 )
            Ifd_ManForEachNodeWithSupp( pMan, j, pLeaf1, c1 )
            {
                assert( (int)pLeaf0->nSupp == i );
                assert( (int)pLeaf1->nSupp == j );
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 0), -1, 1 );
                if ( !pLeaf1->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 1), -1, 1 );
                if ( !pLeaf0->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 1), Abc_Var2Lit(c1, 0), -1, 1 );
                if ( !pLeaf0->fWay && !pLeaf1->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 1), Abc_Var2Lit(c1, 1), -1, 1 );
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 0), -1, 2 );
            }
        }
        // create MUX
        if ( fUseMux )
        for ( i = 1; i < v-1; i++ )
        for ( j = 1; j < v-1; j++ )
        for ( k = 1; k < v-1; k++ )
        if ( i + j + k == v )
        {
            Ifd_ManForEachNodeWithSupp( pMan, i, pLeaf0, c0 )
            Ifd_ManForEachNodeWithSupp( pMan, j, pLeaf1, c1 )
            Ifd_ManForEachNodeWithSupp( pMan, k, pLeaf2, c2 )
            {
                assert( (int)pLeaf0->nSupp == i );
                assert( (int)pLeaf1->nSupp == j );
                assert( (int)pLeaf2->nSupp == k );
//printf( "%d %d %d   ", i, j, k );
//printf( "%d %d %d\n", Ifd_ObjId(pMan, pLeaf0), Ifd_ObjId(pMan, pLeaf1), Ifd_ObjId(pMan, pLeaf2) );
                if ( pLeaf2->fWay && c0 < c1 )
                    continue;
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 0), Abc_Var2Lit(c2, 0), 3 );
                if ( !pLeaf0->fWay && !pLeaf1->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 1), Abc_Var2Lit(c1, 0), Abc_Var2Lit(c2, 0), 3 );
            }
        }
        // bookmark
        Vec_IntPush( pMan->vMarks, pMan->nObjs );
    }
    Ifd_ManTruthAll( pMan );
    Mpm_ComputeCnfSizeAll( pMan );
//    Ifd_ManPrint( pMan );
    vTruths = pMan->vTruths; pMan->vTruths = NULL;
    Ifd_ManStop( pMan );
    return vTruths;
}